

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStringList::splitstr(CBStringList *this,CBString *b,CBString *s)

{
  CBString *pCVar1;
  uchar splitChar;
  int iVar2;
  int iVar3;
  int iVar4;
  CBString local_80;
  CBString local_68;
  CBString local_40;
  int local_28;
  int local_24;
  int i;
  int p;
  CBString *s_local;
  CBString *b_local;
  CBStringList *this_local;
  
  _i = s;
  s_local = b;
  b_local = (CBString *)this;
  iVar2 = CBString::length(s);
  pCVar1 = s_local;
  if (iVar2 == 1) {
    splitChar = CBString::character(_i,0);
    split(this,pCVar1,splitChar);
  }
  else {
    iVar2 = CBString::length(_i);
    if (iVar2 == 0) {
      for (local_28 = 0; iVar2 = local_28, iVar3 = CBString::length(s_local), iVar2 < iVar3;
          local_28 = local_28 + 1) {
        CBString::CBString(&local_40,(s_local->super_tagbstring).data[local_28]);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::push_back
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_40);
        CBString::~CBString(&local_40);
      }
    }
    else {
      local_24 = 0;
      while (local_28 = CBString::find(s_local,_i,local_24), iVar2 = local_24, -1 < local_28) {
        CBString::midstr(&local_68,s_local,local_24,local_28 - local_24);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::push_back
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_68);
        CBString::~CBString(&local_68);
        iVar2 = local_28;
        local_24 = CBString::length(_i);
        local_24 = iVar2 + local_24;
      }
      iVar4 = CBString::length(s_local);
      pCVar1 = s_local;
      iVar3 = local_24;
      if (iVar2 <= iVar4) {
        iVar2 = CBString::length(s_local);
        CBString::midstr(&local_80,pCVar1,iVar3,iVar2 - local_24);
        std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::push_back
                  ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_80);
        CBString::~CBString(&local_80);
      }
    }
  }
  return;
}

Assistant:

void CBStringList::splitstr (const CBString& b, const CBString& s) {
int p, i;

	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else if (s.length() == 0) {
		for (i=0; i < b.length (); i++) {
			this->push_back (CBString (b.data[i]));
		}
	} else {
		for (p=0; (i = b.find (s, p)) >= 0; p = i + s.length ()) {
			this->push_back (b.midstr (p, i - p));
		}
		if (p <= b.length ()) {
			this->push_back (b.midstr (p, b.length () - p));
		}
	}
}